

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O2

void __thiscall L18_1::Useless::~Useless(Useless *this)

{
  std::operator<<((ostream *)&std::cout,"\ndestructor called, instance left: ");
}

Assistant:

Useless::~Useless() {
        cout << "\ndestructor called, instance left: " << --count << endl;
        cout << "deleted one: \n";
        showObject();
        delete [] pc;   //  delete the one created by 'new'

        cout << endl;
    }